

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O2

int testGetFullTerritoryName(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  TerritoryAlphabets *pTVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  Territory TVar12;
  uint local_52c;
  char s [8];
  char expectedLocalName [112];
  char territoryName [1135];
  
  testGetFullTerritoryNameInLocale("Sancta Sedes",TERRITORY_VAT,0,(char *)0x0);
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"E");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"EN");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"??");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"-");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"_");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"_EN");
  iVar3 = 0x10;
  local_52c = 0;
  uVar11 = 0;
  for (lVar8 = 0; lVar8 != 0x1b; lVar8 = lVar8 + 1) {
    pcVar7 = testGetFullTerritoryName::locales_to_test[lVar8];
    for (TVar12 = TERRITORY_VAT; TVar12 != _TERRITORY_MAX; TVar12 = TVar12 + 1) {
      iVar9 = 0;
      getFullTerritoryNameInLocaleUtf8(expectedLocalName,TVar12,0,(char *)0x0);
      testGetFullTerritoryNameInLocale(expectedLocalName,TVar12,0,(char *)0x0);
      testGetFullTerritoryNameInLocale("",TVar12,-1,pcVar7);
      testGetFullTerritoryNameInLocale("",TVar12,999,pcVar7);
      while( true ) {
        iVar1 = getFullTerritoryNameInLocaleUtf8(territoryName,TVar12,iVar9,pcVar7);
        if (iVar1 == 0) break;
        sVar4 = strlen(territoryName);
        uVar2 = (uint)sVar4;
        if (uVar2 - 0x70 < 0xffffff91) {
          foundError();
          pcVar5 = getTerritoryIsoName(s,TVar12,0);
          printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",pcVar7,
                 pcVar5,sVar4 & 0xffffffff,0x6f,territoryName);
        }
        if ((int)uVar2 < (int)uVar11) {
          uVar2 = uVar11;
        }
        uVar11 = uVar2;
        iVar9 = iVar9 + 1;
      }
      local_52c = local_52c + iVar9;
      iVar3 = iVar3 + 6 + iVar9;
    }
  }
  TVar12 = TERRITORY_VAT;
  do {
    if (TVar12 == _TERRITORY_MAX) {
      printf("%d territory names, max length %d characters\n",(ulong)local_52c,(ulong)uVar11);
      testGetFullTerritoryNameInLocale("Netherlands",TERRITORY_NLD,0,"en_US");
      testGetFullTerritoryNameInLocale("The Netherlands",TERRITORY_NLD,1,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_NLD,2,"en_US");
      testGetFullTerritoryNameInLocale("Russia",TERRITORY_RUS,0,"en_US");
      testGetFullTerritoryNameInLocale("Russian Federation",TERRITORY_RUS,1,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_RUS,2,"en_US");
      testGetFullTerritoryNameInLocale(anon_var_dwarf_3cc03 + 0x1d,TERRITORY_KAZ,0,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_KAZ,1,"en_US");
      testGetFullTerritoryNameInLocale("Turkmenistan",TERRITORY_TKM,0,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_TKM,1,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_TKM,2,"en_US");
      testGetFullTerritoryNameInLocale("",TERRITORY_TKM,999,"en_US");
      testGetFullTerritoryNameInLocale("Nederland",TERRITORY_NLD,0,"nl");
      testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"nl");
      testGetFullTerritoryNameInLocale("Vaticaanstad",TERRITORY_VAT,0,"nl");
      testGetFullTerritoryNameInLocale("Heilige Stoel",TERRITORY_VAT,1,"nl");
      testGetFullTerritoryNameInLocale("",TERRITORY_VAT,2,"nl");
      testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"nl");
      testGetFullTerritoryNameInLocale("Pays-Bas",TERRITORY_NLD,0,"fr");
      testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"fr");
      testGetFullTerritoryNameInLocale(anon_var_dwarf_f07 + 9,TERRITORY_VAT,0,"fr");
      testGetFullTerritoryNameInLocale(anon_var_dwarf_f07,TERRITORY_VAT,1,"fr");
      testGetFullTerritoryNameInLocale(anon_var_dwarf_4635a + 0x19,TERRITORY_VAT,2,"fr");
      testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"fr");
      testGetFullTerritoryNameLocal("Nederland",TERRITORY_NLD,0);
      testGetFullTerritoryNameLocal("",TERRITORY_NLD,1);
      testGetFullTerritoryNameLocalInAlphabet("Nederland",TERRITORY_NLD,0,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,1,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,ALPHABET_GREEK);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MIN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MAX);
      testGetFullTerritoryNameLocal(anon_var_dwarf_f29,TERRITORY_RUS,0);
      testGetFullTerritoryNameLocal("",TERRITORY_RUS,1);
      testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_f29,TERRITORY_RUS,0,ALPHABET_CYRILLIC);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_GREEK);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MIN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MAX);
      testGetFullTerritoryNameLocal(anon_var_dwarf_f40,TERRITORY_KAZ,0);
      testGetFullTerritoryNameLocal("Qazaqstan",TERRITORY_KAZ,1);
      testGetFullTerritoryNameLocal(anon_var_dwarf_3cc03 + 0x1d,TERRITORY_KAZ,2);
      testGetFullTerritoryNameLocal("",TERRITORY_KAZ,3);
      testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_f40,TERRITORY_KAZ,0,ALPHABET_CYRILLIC);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,1,ALPHABET_CYRILLIC);
      testGetFullTerritoryNameLocalInAlphabet("Qazaqstan",TERRITORY_KAZ,0,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet
                (anon_var_dwarf_3cc03 + 0x1d,TERRITORY_KAZ,1,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,2,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
      testGetFullTerritoryNameLocal(anon_var_dwarf_f56,TERRITORY_TKM,0);
      testGetFullTerritoryNameLocal(anon_var_dwarf_f6d,TERRITORY_TKM,1);
      testGetFullTerritoryNameLocal(anon_var_dwarf_3c845 + 0x27,TERRITORY_TKM,2);
      testGetFullTerritoryNameLocal("",TERRITORY_TKM,3);
      testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_f6d,TERRITORY_TKM,0,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ROMAN);
      testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_f56,TERRITORY_TKM,0,ALPHABET_CYRILLIC);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_CYRILLIC);
      testGetFullTerritoryNameLocalInAlphabet
                (anon_var_dwarf_3c845 + 0x27,TERRITORY_TKM,0,ALPHABET_ARABIC);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ARABIC);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
      testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
      return iVar3 + 0x7e;
    }
    pTVar6 = getAlphabetsForTerritory(TVar12);
    for (lVar8 = 0; lVar8 < pTVar6->count; lVar8 = lVar8 + 1) {
      iVar9 = getFullTerritoryNameLocalInAlphabetUtf8
                        (territoryName,TVar12,0,pTVar6->alphabet[lVar8]);
      if (iVar9 == 0) {
        foundError();
        pcVar7 = getTerritoryIsoName(expectedLocalName,TVar12,0);
        printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n"
               ,pcVar7,(ulong)(uint)pTVar6->alphabet[0]);
      }
    }
    pTVar6 = getAlphabetsForTerritory(TVar12);
    for (uVar10 = 0; (long)uVar10 < (long)pTVar6->count; uVar10 = uVar10 + 1) {
      iVar9 = getFullTerritoryNameLocalInAlphabetUtf8
                        (territoryName,TVar12,0,pTVar6->alphabet[uVar10]);
      if (iVar9 == 0) {
        foundError();
        pcVar7 = getTerritoryIsoName(expectedLocalName,TVar12,0);
        printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n"
               ,pcVar7,(ulong)(uint)pTVar6->alphabet[uVar10]);
      }
      iVar9 = getFullTerritoryNameLocalUtf8(expectedLocalName,TVar12,(int)uVar10);
      if (iVar9 == 0) {
LAB_001c960e:
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n"
               ,territoryName,uVar10 & 0xffffffff,expectedLocalName);
      }
      else {
        iVar9 = strcmp(territoryName,expectedLocalName);
        if (iVar9 != 0) goto LAB_001c960e;
      }
    }
    iVar3 = iVar3 + (int)lVar8 + 1;
    TVar12 = TVar12 + 1;
  } while( true );
}

Assistant:

int testGetFullTerritoryName(void) {
    int nrTests = 0;
    enum Territory territory;
    int nrNames = 0;
    int maxLength = 0;
    int alternative;
    int i;
    const TerritoryAlphabets *territoryAlphabets;
    char territoryName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1024]; // large so we can test overflow
    static const char *locales_to_test[] = {
            "AF", "AR", "BE", "CN", "CS", "DA", "DE", "EN", "FI", "ES", "FR", "HE", "HI",
            "HR", "ID", "IT", "JA", "KO", "NL", "NO", "PL", "PT", "RU", "SV", "SW", "TR", "UK"};

    nrTests += testGetFullTerritoryNameInLocale("Sancta Sedes", TERRITORY_VAT, 0, NULL);    // Local name.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "");           // Wrong locale -> fallback language.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "E");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "EN");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "??");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "-");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_EN");

    for (i = 0; i < (int) (sizeof(locales_to_test) / sizeof(locales_to_test[0])); i++) {
        const char *locale = locales_to_test[i];
        int nrInLocale = 0;
        for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
            char expectedLocalName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            getFullTerritoryNameInLocaleUtf8(expectedLocalName, territory, 0, 0);

            nrTests += testGetFullTerritoryNameInLocale(expectedLocalName, territory, 0, NULL);
            nrTests += testGetFullTerritoryNameInLocale("", territory, -1, locale);
            nrTests += testGetFullTerritoryNameInLocale("", territory, 999, locale);
            for (alternative = 0;; alternative++) {
                int len;
                if (!getFullTerritoryNameInLocaleUtf8(territoryName, territory, alternative, locale)) {
                    break;
                }
                ++nrInLocale;
                ++nrNames;
                len = (int) strlen(territoryName);
                nrTests++;
                if (len < 1 || len > MAX_TERRITORY_FULLNAME_UTF8_LEN) {
                    char s[MAX_ISOCODE_ASCII_LEN + 1];
                    foundError();
                    printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",
                           locale, getTerritoryIsoName(s, territory, 0), len,
                           MAX_TERRITORY_FULLNAME_UTF8_LEN, territoryName);
                }
                if (len > maxLength) {
                    maxLength = len;
                }
            }
        }
    }

    // check that every territory has a local name in all the common alphabets
    for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            nrTests++;
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0,
                                                         territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[0]);
            }
        }

        // check that the x-th local name is in the x-th common alphabet
        nrTests++;
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            char territoryNameLocal[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0, territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[i]);
            }
            if (!getFullTerritoryNameLocalUtf8(territoryNameLocal, territory, i) ||
                strcmp(territoryName, territoryNameLocal)) {
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n",
                       territoryName, i, territoryNameLocal);
            }
        }
    }
    printf("%d territory names, max length %d characters\n", nrNames, maxLength);

    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("The Netherlands", TERRITORY_NLD, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russia", TERRITORY_RUS, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russian Federation", TERRITORY_RUS, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_RUS, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Kazakhstan", TERRITORY_KAZ, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_KAZ, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Turkmenistan", TERRITORY_TKM, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 999, "en_US");

#ifdef MAPCODE_SUPPORT_LANGUAGE_NL
    nrTests += testGetFullTerritoryNameInLocale("Nederland", TERRITORY_NLD, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Vaticaanstad", TERRITORY_VAT, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Heilige Stoel", TERRITORY_VAT, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 2, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "nl");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "nl");
#endif

#ifdef MAPCODE_SUPPORT_LANGUAGE_FR
    nrTests += testGetFullTerritoryNameInLocale("Pays-Bas", TERRITORY_NLD, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Cit\xC3\xA9 du Vatican", TERRITORY_VAT, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Saint-Si\xC3\xA8ge", TERRITORY_VAT, 2, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "fr");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "fr");
#endif

    nrTests += testGetFullTerritoryNameLocal("Nederland", TERRITORY_NLD, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_NLD, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Nederland", TERRITORY_NLD, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Росси́я", TERRITORY_RUS, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_RUS, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Росси́я", TERRITORY_RUS, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Қазақстан", TERRITORY_KAZ, 0);
    nrTests += testGetFullTerritoryNameLocal("Qazaqstan", TERRITORY_KAZ, 1);
    nrTests += testGetFullTerritoryNameLocal("Kazakhstan", TERRITORY_KAZ, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_KAZ, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Қазақстан", TERRITORY_KAZ, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Qazaqstan", TERRITORY_KAZ, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Kazakhstan", TERRITORY_KAZ, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 2, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Түркменистан", TERRITORY_TKM, 0);
    nrTests += testGetFullTerritoryNameLocal("Türkmenistan", TERRITORY_TKM, 1);
    nrTests += testGetFullTerritoryNameLocal("تۆركمنيستآن", TERRITORY_TKM, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_TKM, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Türkmenistan", TERRITORY_TKM, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Түркменистан", TERRITORY_TKM, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("تۆركمنيستآن", TERRITORY_TKM, 0, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);

    return nrTests;
}